

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

cmJSONHelper<std::nullptr_t> *
cmCMakePresetsGraphInternal::VendorHelper
          (cmJSONHelper<std::nullptr_t> *__return_storage_ptr__,ErrorGenerator *error)

{
  function<void_(const_Json::Value_*,_cmJSONState_*)> *this;
  _Any_data local_30;
  code *local_20;
  
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_30,error);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  this = (function<void_(const_Json::Value_*,_cmJSONState_*)> *)operator_new(0x20);
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            (this,(function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_30);
  *(function<void_(const_Json::Value_*,_cmJSONState_*)> **)
   &(__return_storage_ptr__->super__Function_base)._M_functor = this;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<bool_(std::nullptr_t_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraphReadJSON.cxx:392:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(std::nullptr_t_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraphReadJSON.cxx:392:10)>
       ::_M_manager;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

cmJSONHelper<std::nullptr_t> VendorHelper(const ErrorGenerator& error)
{
  return [error](std::nullptr_t& /*out*/, const Json::Value* value,
                 cmJSONState* state) -> bool {
    if (!value) {
      return true;
    }

    if (!value->isObject()) {
      error(value, state);
      return false;
    }

    return true;
  };
}